

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_tail_multiple.h
# Opt level: O0

void density::detail::swap
               (SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
                *i_first,
               SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
               *i_second)

{
  __pointer_type __p;
  __pointer_type __p_00;
  __pointer_type tmp1;
  SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  *i_second_local;
  SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  *i_first_local;
  
  swap((LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
        *)i_first,
       (LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
        *)i_second);
  std::swap<density::detail::LfQueueControl*>(&i_first->m_tail,&i_second->m_tail);
  __p = std::atomic<density::detail::LfQueueControl_*>::load
                  (&i_second->m_initial_page,memory_order_seq_cst);
  __p_00 = std::atomic<density::detail::LfQueueControl_*>::load
                     (&i_first->m_initial_page,memory_order_seq_cst);
  std::atomic<density::detail::LfQueueControl_*>::store
            (&i_second->m_initial_page,__p_00,memory_order_seq_cst);
  std::atomic<density::detail::LfQueueControl_*>::store
            (&i_first->m_initial_page,__p,memory_order_seq_cst);
  return;
}

Assistant:

void
              swap(SpQueue_TailMultiple & i_first, SpQueue_TailMultiple & i_second) noexcept
            {
                // swap the base
                swap(static_cast<Base &>(i_first), static_cast<Base &>(i_second));

                // swap m_tail
                std::swap(i_first.m_tail, i_second.m_tail);

                // swap m_initial_page
                auto const tmp1 = i_second.m_initial_page.load();
                i_second.m_initial_page.store(i_first.m_initial_page.load());
                i_first.m_initial_page.store(tmp1);
            }